

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# host_strduptrim.c
# Opt level: O2

char * host_strduptrim(char *s)

{
  byte *pbVar1;
  ushort **ppuVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  byte bVar6;
  byte *__s;
  
  if (*s != '[') {
LAB_001352af:
    pcVar4 = dupstr(s);
    return pcVar4;
  }
  pbVar1 = (byte *)(s + 1);
  iVar5 = 0;
  __s = pbVar1;
LAB_0013522d:
  bVar6 = *__s;
  if (((ulong)bVar6 == 0) || (bVar6 == 0x5d)) goto LAB_00135275;
  ppuVar2 = __ctype_b_loc();
  if ((*(byte *)((long)*ppuVar2 + (ulong)bVar6 * 2 + 1) & 0x10) == 0) {
    if (bVar6 != 0x3a) {
      if (bVar6 != 0x25) goto LAB_001352af;
      sVar3 = strcspn((char *)__s,"]");
      bVar6 = __s[sVar3];
      __s = __s + sVar3;
LAB_00135275:
      if ((bVar6 == 0x5d) && (1 < iVar5 && __s[1] == 0)) {
        pcVar4 = dupprintf("%.*s",(ulong)(uint)((int)__s - (int)pbVar1),pbVar1);
        return pcVar4;
      }
      goto LAB_001352af;
    }
    iVar5 = iVar5 + 1;
  }
  __s = __s + 1;
  goto LAB_0013522d;
}

Assistant:

char *host_strduptrim(const char *s)
{
    if (s[0] == '[') {
        const char *p = s+1;
        int colons = 0;
        while (*p && *p != ']') {
            if (isxdigit((unsigned char)*p))
                /* OK */;
            else if (*p == ':')
                colons++;
            else
                break;
            p++;
        }
        if (*p == '%') {
            /*
             * This delimiter character introduces an RFC 4007 scope
             * id suffix (e.g. suffixing the address literal with
             * %eth1 or %2 or some such). There's no syntax
             * specification for the scope id, so just accept anything
             * except the closing ].
             */
            p += strcspn(p, "]");
        }
        if (*p == ']' && !p[1] && colons > 1) {
            /*
             * This looks like an IPv6 address literal (hex digits and
             * at least two colons, plus optional scope id, contained
             * in square brackets). Trim off the brackets.
             */
            return dupprintf("%.*s", (int)(p - (s+1)), s+1);
        }
    }

    /*
     * Any other shape of string is simply duplicated.
     */
    return dupstr(s);
}